

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

void insert_flipped_container
               (roaring_array_t *ans_arr,roaring_array_t *x1_arr,uint16_t hb,uint16_t lb_start,
               uint16_t lb_end)

{
  int32_t iVar1;
  uint32_t range_start;
  int iVar2;
  container_t *pcVar3;
  container_t *c;
  undefined2 in_CX;
  undefined2 in_DX;
  roaring_array_t *in_RSI;
  undefined2 in_R8W;
  container_t *container_to_flip;
  container_t *flipped_container;
  uint8_t ctype_out;
  uint8_t ctype_in;
  int j;
  int i;
  roaring_array_t *in_stack_ffffffffffffffc8;
  uint8_t uVar4;
  uint8_t *result_type;
  uint32_t in_stack_ffffffffffffffd8;
  uint16_t key;
  uint32_t in_stack_ffffffffffffffdc;
  undefined2 in_stack_ffffffffffffffe8;
  
  iVar1 = ra_get_index(in_stack_ffffffffffffffc8,0);
  range_start = ra_get_index(in_stack_ffffffffffffffc8,0);
  uVar4 = (uint8_t)((ulong)in_stack_ffffffffffffffc8 >> 0x38);
  result_type = (uint8_t *)0x0;
  if (iVar1 < 0) {
    pcVar3 = container_range_of_ones
                       (in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8,(uint8_t *)0x0);
    ra_insert_new_key_value_at
              ((roaring_array_t *)CONCAT44(iVar1,range_start),in_stack_ffffffffffffffdc,
               (uint16_t)(in_stack_ffffffffffffffd8 >> 0x10),pcVar3,uVar4);
  }
  else {
    pcVar3 = ra_get_container_at_index(in_RSI,(uint16_t)iVar1,&stack0xffffffffffffffdf);
    key = (uint16_t)(in_stack_ffffffffffffffd8 >> 0x10);
    c = container_not_range((container_t *)
                            CONCAT26(in_DX,CONCAT24(in_CX,CONCAT22(in_R8W,in_stack_ffffffffffffffe8)
                                                   )),(uint8_t)((uint)iVar1 >> 0x18),range_start,
                            in_stack_ffffffffffffffdc,result_type);
    iVar2 = container_get_cardinality(pcVar3,'\0');
    uVar4 = (uint8_t)((ulong)pcVar3 >> 0x38);
    if (iVar2 == 0) {
      container_free(c,uVar4);
    }
    else {
      ra_insert_new_key_value_at
                ((roaring_array_t *)CONCAT44(iVar1,range_start),in_stack_ffffffffffffffdc,key,c,
                 uVar4);
    }
  }
  return;
}

Assistant:

static void insert_flipped_container(roaring_array_t *ans_arr,
                                     const roaring_array_t *x1_arr, uint16_t hb,
                                     uint16_t lb_start, uint16_t lb_end) {
    const int i = ra_get_index(x1_arr, hb);
    const int j = ra_get_index(ans_arr, hb);
    uint8_t ctype_in, ctype_out;
    container_t *flipped_container = NULL;
    if (i >= 0) {
        container_t *container_to_flip =
            ra_get_container_at_index(x1_arr, (uint16_t)i, &ctype_in);
        flipped_container =
            container_not_range(container_to_flip, ctype_in, (uint32_t)lb_start,
                                (uint32_t)(lb_end + 1), &ctype_out);

        if (container_get_cardinality(flipped_container, ctype_out))
            ra_insert_new_key_value_at(ans_arr, -j - 1, hb, flipped_container,
                                       ctype_out);
        else {
            container_free(flipped_container, ctype_out);
        }
    } else {
        flipped_container = container_range_of_ones(
            (uint32_t)lb_start, (uint32_t)(lb_end + 1), &ctype_out);
        ra_insert_new_key_value_at(ans_arr, -j - 1, hb, flipped_container,
                                   ctype_out);
    }
}